

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

bool __thiscall ON_3dmViewTraceImage::Read(ON_3dmViewTraceImage *this,ON_BinaryArchive *file)

{
  bool bVar1;
  wchar_t *full_path;
  int minor_version;
  ON_wString bitmap_filename;
  int major_version;
  int local_34;
  ON_wString local_30;
  int local_24;
  
  local_24 = 0;
  local_34 = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_24,&local_34);
  if (!bVar1) {
    return false;
  }
  if (local_24 != 1) {
    return false;
  }
  ON_wString::ON_wString(&local_30);
  bVar1 = ON_BinaryArchive::ReadString(file,&local_30);
  if (bVar1) {
    full_path = ON_wString::operator_cast_to_wchar_t_(&local_30);
    ON_FileReference::SetFullPath(&this->m_image_file_reference,full_path,false);
    bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_width);
    if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_height), bVar1)) {
      bVar1 = ON_BinaryArchive::ReadPlane(file,&this->m_plane);
      goto LAB_00376987;
    }
  }
  bVar1 = false;
LAB_00376987:
  if (0 < local_34) {
    if (bVar1 == false) {
      bVar1 = false;
    }
    else {
      bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bGrayScale);
    }
    if (1 < local_34) {
      if (bVar1 != false) {
        bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bHidden);
      }
      if (2 < local_34) {
        if (bVar1 != false) {
          bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bFiltered);
        }
        if ((bVar1 != false) && (3 < local_34)) {
          bVar1 = ON_FileReference::Read(&this->m_image_file_reference,file);
        }
      }
    }
  }
  ON_wString::~ON_wString(&local_30);
  return bVar1;
}

Assistant:

bool ON_3dmViewTraceImage::Read( ON_BinaryArchive& file )
{
  // opennurbs version  < 200307300 - version 1.0 or 1.1 chunk
  // opennurbs version >= 200307300 - version 1.2 chunk
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1)
  {
    ON_wString bitmap_filename;
    if (rc) rc = file.ReadString( bitmap_filename );
    if (rc)
      m_image_file_reference.SetFullPath(bitmap_filename, false);
    if (rc) rc = file.ReadDouble( &m_width );
    if (rc) rc = file.ReadDouble( &m_height );
    if (rc) rc = file.ReadPlane( m_plane );
    if ( minor_version >= 1 )
    {
      if (rc) rc = file.ReadBool(&m_bGrayScale);
      
      if ( minor_version >= 2 )
      {
        if (rc) rc = file.ReadBool(&m_bHidden);
        
        if ( minor_version >= 3 )
        {
          if (rc) rc = file.ReadBool( &m_bFiltered );

          if (rc && minor_version >= 4)
          {
            rc = m_image_file_reference.Read(file);
          }
        }
      }
    }
  }
  else
    rc = false;
  return rc;
}